

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.hpp
# Opt level: O0

void __thiscall
poincare_disc::Distance<double>::backward
          (Distance<double> *this,Vector<double> *grad_u,Vector<double> *grad_v,real grad_output)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  real in_RDX;
  Vector<double> *in_RSI;
  Vector<double> *in_RDI;
  Vector<double> *in_XMM0_Qa;
  double dVar2;
  Vector<double> *v;
  real cv;
  real cu;
  real c;
  Vector<double> *v_00;
  
  p_Var1 = in_RDI[3].data_.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (((double)p_Var1 != 1.0) || (NAN((double)p_Var1))) {
    v_00 = in_XMM0_Qa;
    dVar2 = sqrt((double)in_RDI[3].data_.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi *
                 (double)in_RDI[3].data_.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + -1.0);
    dVar2 = (4.0 / dVar2) * (double)in_XMM0_Qa;
    v = (Vector<double> *)
        (dVar2 / (double)in_RDI[3].data_.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    Vector<double>::assign_(in_RSI,in_RDX,v_00);
    Vector<double>::add_(v_00,dVar2,v);
    Vector<double>::assign_(in_RSI,in_RDX,v_00);
    Vector<double>::add_(v_00,dVar2,v);
  }
  else {
    Vector<double>::zero_(in_RDI);
    Vector<double>::zero_(in_RDI);
  }
  return;
}

Assistant:

void backward(Vector<real>& grad_u, Vector<real>& grad_v, real grad_output)
    {
      real c = grad_output;
      
      if(gamma_ == 1){
        grad_u.zero_();
        grad_v.zero_();
        return;
      }

      c *= 4 / std::sqrt(gamma_ * gamma_ - 1);
      real cu = c / beta_; 
      real cv = c / alpha_;
  
      grad_u.assign_(cu * (vv_ - 2 * uv_ + 1) / alpha_ / alpha_, u_);
      grad_u.add_(-cu / alpha_, v_);

      grad_v.assign_(cv * (uu_ - 2 * uv_ + 1) / beta_ / beta_, v_);
      grad_v.add_(-cv / beta_, u_);
      
    }